

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_index_tree.cpp
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
duckdb::WindowIndexTree::SelectNth(WindowIndexTree *this,SubFrames *frames,idx_t n)

{
  ElementType_conflict EVar1;
  pointer pMVar2;
  pointer pMVar3;
  ElementType EVar4;
  unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
  *this_00;
  unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
  *this_01;
  pair<unsigned_long,_unsigned_long> pVar5;
  
  if ((this->super_WindowMergeSortTree).mst32.
      super_unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
      .
      super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_*,_false>
      ._M_head_impl ==
      (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *)0x0) {
    this_01 = &(this->super_WindowMergeSortTree).mst64;
    pMVar3 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
             ::operator->(this_01);
    pVar5 = MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
            SelectNth(pMVar3,frames,n);
    if (pVar5.second != 0) {
      return pVar5;
    }
    pMVar3 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
             ::operator->(this_01);
    EVar4 = MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
            NthElement(pMVar3,pVar5.first);
  }
  else {
    this_00 = &(this->super_WindowMergeSortTree).mst32;
    pMVar2 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
             ::operator->(this_00);
    pVar5 = MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::
            SelectNth(pMVar2,frames,n);
    if (pVar5.second != 0) {
      return pVar5;
    }
    pMVar2 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
             ::operator->(this_00);
    EVar1 = MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::
            NthElement(pMVar2,pVar5.first);
    EVar4 = (ElementType)EVar1;
  }
  pVar5.second = 0;
  pVar5.first = EVar4;
  return pVar5;
}

Assistant:

pair<idx_t, idx_t> WindowIndexTree::SelectNth(const SubFrames &frames, idx_t n) const {
	if (mst32) {
		const auto nth = mst32->SelectNth(frames, n);
		if (nth.second) {
			return nth;
		} else {
			return {mst32->NthElement(nth.first), 0};
		}
	} else {
		const auto nth = mst64->SelectNth(frames, n);
		if (nth.second) {
			return nth;
		} else {
			return {mst64->NthElement(nth.first), 0};
		}
	}
}